

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O2

c_v64 c_v64_pack_s16_u8(c_v64 a,c_v64 b)

{
  undefined1 auVar1 [32];
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  auVar6 = vpinsrd_avx(ZEXT416(a.u32[1]),(int)((ulong)a >> 0x10),1);
  auVar6 = vpinsrd_avx(auVar6,a.u32[0],2);
  iVar3 = b.s32[1] >> 0x10;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  if (0xfe < iVar3) {
    iVar3 = 0xff;
  }
  iVar5 = (int)((ulong)b >> 0x10) >> 0x10;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  if (0xfe < iVar5) {
    iVar5 = 0xff;
  }
  uVar2 = b.s32[0] >> 0x10;
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  if (0xfe < (int)uVar2) {
    uVar2 = 0xff;
  }
  uVar4 = 0;
  if (0 < b.s16[0]) {
    uVar4 = (int)b.s16[0];
  }
  if (0xfe < (int)uVar4) {
    uVar4 = 0xff;
  }
  auVar6 = vpinsrd_avx(auVar6,a.u32[0] << 0x10,3);
  auVar6 = vpsrad_avx(auVar6,0x10);
  auVar6 = vpmaxsd_avx(auVar6,(undefined1  [16])0x0);
  auVar7._8_4_ = 0xff;
  auVar7._0_8_ = 0xff000000ff;
  auVar7._12_4_ = 0xff;
  auVar6 = vpminsd_avx(auVar6,auVar7);
  auVar1 = vpmovzxdq_avx2(auVar6);
  auVar1 = vpsllvq_avx2(auVar1,_DAT_00a76d00);
  auVar6 = vpor_avx(auVar1._0_16_,auVar1._16_16_);
  auVar7 = vpshufd_avx(auVar6,0xee);
  auVar6 = vpor_avx(auVar6,auVar7);
  return (c_v64)((ulong)(uVar2 << 8 | iVar5 << 0x10 | iVar3 << 0x18 | uVar4) | auVar6._0_8_);
}

Assistant:

SIMD_INLINE c_v64 c_v64_pack_s16_u8(c_v64 a, c_v64 b) {
  c_v64 t;
  if (CONFIG_BIG_ENDIAN) {
    c_v64 u = a;
    a = b;
    b = u;
  }
  t.u8[7] = SIMD_CLAMP(a.s16[3], 0, 255);
  t.u8[6] = SIMD_CLAMP(a.s16[2], 0, 255);
  t.u8[5] = SIMD_CLAMP(a.s16[1], 0, 255);
  t.u8[4] = SIMD_CLAMP(a.s16[0], 0, 255);
  t.u8[3] = SIMD_CLAMP(b.s16[3], 0, 255);
  t.u8[2] = SIMD_CLAMP(b.s16[2], 0, 255);
  t.u8[1] = SIMD_CLAMP(b.s16[1], 0, 255);
  t.u8[0] = SIMD_CLAMP(b.s16[0], 0, 255);
  return t;
}